

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

void __thiscall ON_Outline::SortFigures(ON_Outline *this,Orientation outer_loop_orientation)

{
  _func_int **pp_Var1;
  ON_OutlineFigure *pOVar2;
  Orientation OVar3;
  bool bVar4;
  ON_OutlineFigure *pOVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  Orientation OVar12;
  uint j;
  ulong uVar13;
  ON_OutlineFigure *parent_outer_figure;
  ON_OutlineFigure *f;
  ON_SimpleArray<ON_OutlineFigure_*> sorted_figures;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures_parent;
  ON_SimpleArray<ON_OutlineFigure_*> ignored_figures;
  ON_SimpleArray<ON_OutlineFigure_*> outer_figures;
  ON_OutlineFigure *local_108;
  ON_ClassArray<ON_OutlineFigure> local_100;
  ON_SimpleArray<ON_OutlineFigure_*> local_e8;
  ON_SimpleArray<ON_OutlineFigure_*> local_d0;
  ulong local_b8;
  ON_Outline *local_b0;
  double local_a8;
  ON_SimpleArray<ON_OutlineFigure_*> local_a0;
  ON_SimpleArray<ON_OutlineFigure_*> local_88;
  ON_ClassArray<ON_OutlineFigure> *local_70;
  _func_int **local_68;
  ON_BoundingBox local_60;
  
  if ((0xfd < (byte)(outer_loop_orientation - NotOriented)) &&
     (this->m_sorted_figure_outer_orientation != Error &&
      this->m_sorted_figure_outer_orientation != outer_loop_orientation)) {
    this->m_sorted_figure_outer_orientation = outer_loop_orientation;
    uVar8 = (this->m_figures).m_count;
    uVar13 = (ulong)uVar8;
    if (0 < (int)uVar8) {
      local_e8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ec58;
      local_e8.m_a = (ON_OutlineFigure **)0x0;
      local_e8.m_count = 0;
      local_e8.m_capacity = 0;
      ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_e8,uVar13);
      local_68 = (_func_int **)&PTR__ON_SimpleArray_0081ec58;
      local_88._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ec58;
      local_88.m_a = (ON_OutlineFigure **)0x0;
      local_88.m_count = 0;
      local_88.m_capacity = 0;
      ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_88,uVar13);
      local_70 = &this->m_figures;
      OVar12 = Clockwise - (outer_loop_orientation == Clockwise);
      lVar9 = 0;
      local_b8 = uVar13;
      local_b0 = this;
      do {
        pOVar5 = (local_b0->m_figures).m_a;
        local_d0._vptr_ON_SimpleArray = (_func_int **)((long)&pOVar5->m_units_per_em + lVar9);
        uVar8 = (uint)(&pOVar5->m_figure_type)[lVar9];
        if ((uVar8 < 5) && ((0x13U >> (uVar8 & 0x1f) & 1) != 0)) {
          local_a8 = ON_OutlineFigure::AreaEstimate
                               ((ON_OutlineFigure *)local_d0._vptr_ON_SimpleArray);
          ON_OutlineFigure::BoundingBox(&local_60,(ON_OutlineFigure *)local_d0._vptr_ON_SimpleArray)
          ;
          OVar3 = ON_OutlineFigure::FigureOrientation
                            ((ON_OutlineFigure *)local_d0._vptr_ON_SimpleArray);
          if (((local_a8 == 0.0) && (!NAN(local_a8))) ||
             ((((bVar4 = ON_IsValid(local_a8), !bVar4 ||
                (bVar4 = ON_BoundingBox::IsNotEmpty(&local_60), !bVar4)) ||
               (bVar4 = ON_BoundingBox::IsPoint(&local_60), bVar4)) ||
              (OVar3 != outer_loop_orientation && OVar12 != OVar3)))) {
            *(Type *)((long)local_d0._vptr_ON_SimpleArray + 5) = NotPerimeter;
            goto LAB_00493d45;
          }
          ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e8,(ON_OutlineFigure **)&local_d0);
        }
        else {
LAB_00493d45:
          ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_88,(ON_OutlineFigure **)&local_d0);
        }
        lVar9 = lVar9 + 0x48;
      } while (uVar13 * 0x48 != lVar9);
      uVar13 = local_e8._16_8_ & 0xffffffff;
      if (1 < local_e8.m_count && local_e8.m_a != (ON_OutlineFigure **)0x0) {
        ON_qsort(local_e8.m_a,uVar13,8,Internal_CompareAreaEstimate);
      }
      pp_Var1 = local_68;
      local_60.m_min.x = (double)local_68;
      local_60.m_min.y = 0.0;
      local_60.m_min.z = 0.0;
      if (uVar13 != 0) {
        ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity
                  ((ON_SimpleArray<ON_OutlineFigure_*> *)&local_60,uVar13);
      }
      local_d0._vptr_ON_SimpleArray = pp_Var1;
      local_d0.m_a = (ON_OutlineFigure **)0x0;
      local_d0.m_count = 0;
      local_d0.m_capacity = 0;
      if (uVar13 != 0) {
        ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_d0,uVar13);
      }
      local_a0._vptr_ON_SimpleArray = pp_Var1;
      local_a0.m_a = (ON_OutlineFigure **)0x0;
      local_a0.m_count = 0;
      local_a0.m_capacity = 0;
      if (uVar13 != 0) {
        ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_a0,uVar13);
        uVar6 = 0;
        do {
          local_100._vptr_ON_ClassArray = (_func_int **)local_e8.m_a[uVar6];
          local_108 = (ON_OutlineFigure *)0x0;
          if (uVar6 != 0) {
            uVar10 = 0;
            do {
              pOVar5 = local_e8.m_a[uVar10];
              bVar4 = ON_OutlineFigure::IsInsideOf
                                ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray,pOVar5,false);
              pOVar2 = local_108;
              if (((bVar4) &&
                  (OVar3 = ON_OutlineFigure::FigureOrientation(pOVar5), pOVar2 = pOVar5,
                  OVar3 != outer_loop_orientation)) &&
                 (OVar3 = ON_OutlineFigure::FigureOrientation(pOVar5), pOVar2 = local_108,
                 OVar12 == OVar3)) {
                local_108 = (ON_OutlineFigure *)0x0;
                pOVar2 = local_108;
              }
              local_108 = pOVar2;
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          if (local_108 == (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append
                      ((ON_SimpleArray<ON_OutlineFigure_*> *)&local_60,
                       (ON_OutlineFigure **)&local_100);
            OVar3 = ON_OutlineFigure::FigureOrientation
                              ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray);
            if (OVar12 == OVar3) goto LAB_00493ed4;
          }
          else {
            ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_d0,(ON_OutlineFigure **)&local_100);
            ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_a0,&local_108);
            OVar3 = ON_OutlineFigure::FigureOrientation
                              ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray);
            if (OVar3 == outer_loop_orientation) {
LAB_00493ed4:
              ON_OutlineFigure::ReverseFigure((ON_OutlineFigure *)local_100._vptr_ON_ClassArray);
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar13);
      }
      if (local_60.m_min.z._0_4_ == 0) {
        local_b0->m_sorted_figure_outer_orientation = Error;
      }
      else if (local_d0.m_count != 0) {
        if (-1 < (long)local_e8._16_8_) {
          local_e8._16_8_ = local_e8._16_8_ & 0xffffffff00000000;
        }
        uVar8 = local_d0.m_count + (uint)(local_d0.m_count == 0);
        local_a8 = (double)(ulong)(local_60.m_min.z._0_4_ + (uint)(local_60.m_min.z._0_4_ == 0));
        dVar11 = 0.0;
        do {
          local_100._vptr_ON_ClassArray =
               *(_func_int ***)((long)local_60.m_min.y + (long)dVar11 * 8);
          if ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray != (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e8,(ON_OutlineFigure **)&local_100);
            uVar13 = 0;
            do {
              if ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray == local_a0.m_a[uVar13]) {
                local_108 = local_d0.m_a[uVar13];
                local_d0.m_a[uVar13] = (ON_OutlineFigure *)0x0;
                local_a0.m_a[uVar13] = (ON_OutlineFigure *)0x0;
                if (local_108 != (ON_OutlineFigure *)0x0) {
                  ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e8,&local_108);
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
          }
          uVar13 = local_b8;
          dVar11 = (double)((long)dVar11 + 1);
        } while (dVar11 != local_a8);
        if (local_88.m_count != 0) {
          uVar6 = 0;
          do {
            local_100._vptr_ON_ClassArray = (_func_int **)local_88.m_a[uVar6];
            if ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray != (ON_OutlineFigure *)0x0) {
              ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e8,(ON_OutlineFigure **)&local_100);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (local_88._16_8_ & 0xffffffff));
        }
        uVar6 = local_b8;
        if (local_e8.m_count == (int)uVar13) {
          iVar7 = (int)local_b8;
          uVar13 = 1;
          if (1 < iVar7) {
            uVar13 = local_b8 & 0xffffffff;
          }
          pOVar5 = (local_b0->m_figures).m_a + -1;
          uVar10 = 0;
LAB_00494027:
          pOVar5 = pOVar5 + 1;
          if (pOVar5 == local_e8.m_a[uVar10]) goto code_r0x00494031;
          local_100._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0081ec10;
          local_100.m_a = (ON_OutlineFigure *)0x0;
          local_100.m_count = 0;
          local_100.m_capacity = 0;
          ON_ClassArray<ON_OutlineFigure>::SetCapacity(&local_100,local_b8);
          uVar13 = 1;
          if (1 < iVar7) {
            uVar13 = uVar6 & 0xffffffff;
          }
          uVar6 = 0;
          do {
            ON_ClassArray<ON_OutlineFigure>::Append(&local_100,local_e8.m_a[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar13 != uVar6);
          ON_ClassArray<ON_OutlineFigure>::operator=(local_70,&local_100);
          ON_ClassArray<ON_OutlineFigure>::~ON_ClassArray(&local_100);
        }
      }
LAB_004940b9:
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_a0);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_d0);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&local_60);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_88);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_e8);
    }
  }
  return;
code_r0x00494031:
  uVar10 = uVar10 + 1;
  if (uVar13 == uVar10) goto LAB_004940b9;
  goto LAB_00494027;
}

Assistant:

void ON_Outline::SortFigures(
  ON_OutlineFigure::Orientation outer_loop_orientation
)
{
  if (
    ON_OutlineFigure::Orientation::Clockwise != outer_loop_orientation
    && ON_OutlineFigure::Orientation::CounterClockwise != outer_loop_orientation
    )
    return;

  if (outer_loop_orientation == m_sorted_figure_outer_orientation)
    return;

  if (ON_OutlineFigure::Orientation::Error == m_sorted_figure_outer_orientation)
    return; // not sortable

   m_sorted_figure_outer_orientation = outer_loop_orientation;

  const int figure_count = m_figures.Count();
  if (figure_count <= 0)
    return;

  const ON_OutlineFigure::Orientation inner_loop_orientation
    = (ON_OutlineFigure::Orientation::Clockwise == outer_loop_orientation)
    ? ON_OutlineFigure::Orientation::CounterClockwise
    : ON_OutlineFigure::Orientation::Clockwise;

  ON_SimpleArray<ON_OutlineFigure*> sorted_figures(figure_count);
  ON_SimpleArray<ON_OutlineFigure*> ignored_figures(figure_count);

  for (int i = 0; i < figure_count; i++)
  {
    ON_OutlineFigure* ptr = &m_figures[i];
    if (
      (ON_OutlineFigure::Type::Perimeter == ptr->FigureType()
        || ON_OutlineFigure::Type::Unknown == ptr->FigureType()
        || ON_OutlineFigure::Type::Unset == ptr->FigureType())
      )
    {
      const double figure_area = ptr->AreaEstimate();
      const ON_BoundingBox figure_bbox = ptr->BoundingBox();
      const ON_OutlineFigure::Orientation figure_orientation = ptr->FigureOrientation();

      if (
        0.0 != figure_area && ON_IsValid(figure_area)
        && figure_bbox.IsNotEmpty() && false == figure_bbox.IsPoint()
        && (outer_loop_orientation == figure_orientation
          || inner_loop_orientation == figure_orientation)
        )
      {
        sorted_figures.Append(ptr);
        continue;
      }

      // Mark this figure has NotPerimeter because something about
      // its path is not valid. This will prevent it from being 
      // used in meshing.
      ptr->m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
    }

    // ignored figures are ones that are not a perimeter of an inner
    // or outer boundary.
    ignored_figures.Append(ptr);
  }

  const unsigned int sorted_figure_count = sorted_figures.UnsignedCount();

  // Sort figures so the ones with largest included area are first.
  sorted_figures.QuickSort(Internal_CompareAreaEstimate);

  // As we look at each element of sorted_figures[], it gets assigned to
  // outer_figures[] or inner_figures[]. If it is assigned to inner_figures[],
  // the smallest figure that contains it is assigned to inner_figures_parent[].
  //
  // Over the years, many more complicated approaches to sorting were tried,
  // all of which attempted to take into account the orientations from the font file. 
  // It is so common for the orientations in the font files to be wrong, 
  // that ignoring them is the most efficient and reliable approach to date.
  // It is extremly common for outer figures to overlap.
  ON_SimpleArray<ON_OutlineFigure*> outer_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures_parent(sorted_figure_count);

  for (  unsigned k = 0; k < sorted_figure_count; ++k)
  {
    ON_OutlineFigure* f = sorted_figures[k];

    // This for(int k0; ...) loop finds the smallest larger figure that contains f and uses
    // the orientation of this containing loop to determine the orientation of f.
    ON_OutlineFigure* parent_outer_figure = nullptr;
    for (unsigned k0 = 0; k0 < k; ++k0)
    {
      // Given our assumptions, it is impossible for bigger_f to be inside of f.
      ON_OutlineFigure* bigger_f = sorted_figures[k0];
      if (false == f->IsInsideOf(bigger_f, false))
        continue;

      if (outer_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an outer loop.
        parent_outer_figure = bigger_f;
      }
      else if (inner_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an inner loop.
        // So f is a nested outer (like the registered trademark glyph)
        parent_outer_figure = nullptr;
      }
    }

    if (nullptr == parent_outer_figure)
    {
      outer_figures.Append(f);
      if (inner_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an outer.
        f->ReverseFigure();
      }
    }
    else
    {
      inner_figures.Append(f);
      inner_figures_parent.Append(parent_outer_figure);
      if (outer_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an inner
        f->ReverseFigure();
      }
    }
  }

  const unsigned outer_count = outer_figures.UnsignedCount();
  const unsigned inner_count = inner_figures.UnsignedCount();

  if ( 0 == outer_count )
  {
    m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Error;
    return;
  }

  if (0 == inner_count)
  {
    return;
  }

  // Sort figures by outer followed by its inners.
  sorted_figures.SetCount(0);
    for (unsigned i = 0; i < outer_count; ++i)
  {
    ON_OutlineFigure* outer_figure = outer_figures[i];
    if (nullptr == outer_figure)
      continue;
    sorted_figures.Append(outer_figure);
    for (unsigned j = 0; j < inner_count; ++j)
    {
      if (outer_figure == inner_figures_parent[j])
      {
        ON_OutlineFigure* inner_figure = inner_figures[j];
        inner_figures[j] = nullptr;
        inner_figures_parent[j] = nullptr;
        if (nullptr != inner_figure)
          sorted_figures.Append(inner_figure);
      }
    }
  }

  // Put single stroke and other non-perimeter figures on the end.
  for (unsigned int k = 0; k < ignored_figures.UnsignedCount(); k++)
  {
    ON_OutlineFigure* f = ignored_figures[k];
    if (nullptr != f)
      sorted_figures.Append(f);
  }

  if (sorted_figures.Count() == figure_count)
  {
    for (int k = 0; k < figure_count; k++)
    {
      if (sorted_figures[k] != &m_figures[k])
      {
        // Need to reorder m_figures[] array
        ON_ClassArray<ON_OutlineFigure> tmp(figure_count);
        for (int i = 0; i < figure_count; i++)
        {
          tmp.Append(*sorted_figures[i]);
        }
        m_figures = tmp;
        break;
      }
    }
  }

  return;
}